

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ErrorCheckRules.cpp
# Opt level: O2

void __thiscall GrcManager::AddToFsmClasses(GrcManager *this,GdlGlyphClassDefn *pglfc,int nPassID)

{
  vector<GdlGlyphClassDefn_*,_std::allocator<GdlGlyphClassDefn_*>_> *pvVar1;
  bool bVar2;
  GdlGlyphClassDefn *local_28;
  
  pvVar1 = this->m_prgvpglfcFsmClasses;
  local_28 = pglfc;
  bVar2 = GdlGlyphClassDefn::IsFsmClass(pglfc,nPassID);
  if (!bVar2) {
    GdlGlyphClassDefn::MarkFsmClass
              (pglfc,nPassID,
               (int)((ulong)((long)pvVar1[nPassID].
                                   super__Vector_base<GdlGlyphClassDefn_*,_std::allocator<GdlGlyphClassDefn_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)pvVar1[nPassID].
                                  super__Vector_base<GdlGlyphClassDefn_*,_std::allocator<GdlGlyphClassDefn_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 3));
    std::vector<GdlGlyphClassDefn_*,_std::allocator<GdlGlyphClassDefn_*>_>::push_back
              (pvVar1 + nPassID,&local_28);
  }
  return;
}

Assistant:

void GrcManager::AddToFsmClasses(GdlGlyphClassDefn * pglfc, int nPassID)
{
	std::vector<GdlGlyphClassDefn *> * pvpglfcThisPass = m_prgvpglfcFsmClasses + nPassID;
	if (pglfc->IsFsmClass(nPassID))
	{
		//	Already assigned an ID for this pass.
		Assert((*pvpglfcThisPass)[pglfc->FsmID(nPassID)] == pglfc);
		return;
	}
	pglfc->MarkFsmClass(nPassID, int(pvpglfcThisPass->size()));
	pvpglfcThisPass->push_back(pglfc);
}